

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O0

_Bool plutovg_skip_ws_and_delim(char **begin,char *end,char delim)

{
  _Bool _Var1;
  char *local_30;
  char *it;
  char *pcStack_20;
  char delim_local;
  char *end_local;
  char **begin_local;
  
  local_30 = *begin;
  it._7_1_ = delim;
  pcStack_20 = end;
  end_local = (char *)begin;
  _Var1 = plutovg_skip_ws(&local_30,end);
  if (_Var1) {
    _Var1 = plutovg_skip_delim(&local_30,pcStack_20,it._7_1_);
    if (_Var1) {
      plutovg_skip_ws(&local_30,pcStack_20);
      *(char **)end_local = local_30;
      begin_local._7_1_ = local_30 < pcStack_20;
    }
    else {
      begin_local._7_1_ = false;
    }
  }
  else {
    begin_local._7_1_ = false;
  }
  return begin_local._7_1_;
}

Assistant:

static inline bool plutovg_skip_ws_and_delim(const char** begin, const char* end, char delim)
{
    const char* it = *begin;
    if(plutovg_skip_ws(&it, end)) {
        if(!plutovg_skip_delim(&it, end, delim))
            return false;
        plutovg_skip_ws(&it, end);
    } else {
        return false;
    }

    *begin = it;
    return it < end;
}